

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

TabCompletion * __thiscall
duckdb::Linenoise::TabComplete(TabCompletion *__return_storage_ptr__,Linenoise *this)

{
  char cVar1;
  code *pcVar2;
  size_t i;
  Completion c;
  
  (__return_storage_ptr__->completions).
  super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
  super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->completions).
  super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
  super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->completions).
  super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
  super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar2 = completionCallback;
  if (completionCallback != (code *)0x0) {
    cVar1 = this->buf[this->pos];
    this->buf[this->pos] = '\0';
    (*pcVar2)(this->buf);
    this->buf[this->pos] = cVar1;
    ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::reserve
              ((vector<duckdb::Completion,_std::allocator<duckdb::Completion>_> *)
               __return_storage_ptr__,0);
    free((void *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TabCompletion Linenoise::TabComplete() const {
	TabCompletion result;
	if (!completionCallback) {
		return result;
	}
	linenoiseCompletions lc;
	lc.cvec = nullptr;
	lc.len = 0;
	// complete based on the cursor position
	auto prev_char = buf[pos];
	buf[pos] = '\0';
	completionCallback(buf, &lc);
	buf[pos] = prev_char;
	result.completions.reserve(lc.len);
	for (idx_t i = 0; i < lc.len; i++) {
		Completion c;
		c.completion = lc.cvec[i];
		c.cursor_pos = c.completion.size();
		c.completion += buf + pos;
		result.completions.emplace_back(std::move(c));
	}
	freeCompletions(&lc);
	return result;
}